

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalLut.c
# Opt level: O3

Gia_Man_t * Gia_ManBalanceInt(Gia_Man_t *p,int nLutSize,int nCutNum,int fVerbose)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  undefined8 uVar5;
  int iVar6;
  Gia_Man_t *p_00;
  size_t sVar7;
  char *pcVar8;
  uint *puVar9;
  Vec_Int_t *pVVar10;
  int *__s;
  Gia_Obj_t *pGVar11;
  Bal_Man_t *p_01;
  Gia_Man_t *pGVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  
  Gia_ManFillValue(p);
  Gia_ManCreateRefs(p);
  p_00 = Gia_ManStart((p->nObjs * 3) / 2);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pName = pcVar8;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar8 = (char *)0x0;
  }
  else {
    sVar7 = strlen(pcVar2);
    pcVar8 = (char *)malloc(sVar7 + 1);
    strcpy(pcVar8,pcVar2);
  }
  p_00->pSpec = pcVar8;
  iVar1 = p_00->nObjsAlloc;
  puVar9 = (uint *)calloc((long)iVar1,4);
  p_00->pMuxes = puVar9;
  pVVar10 = (Vec_Int_t *)malloc(0x10);
  iVar6 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar6 = iVar1;
  }
  pVVar10->nCap = iVar6;
  if (iVar6 == 0) {
    pVVar10->pArray = (int *)0x0;
    pVVar10->nSize = iVar1;
  }
  else {
    __s = (int *)malloc((long)iVar6 << 2);
    pVVar10->pArray = __s;
    pVVar10->nSize = iVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)iVar1 << 2);
    }
  }
  p_00->vLevels = pVVar10;
  p->pObjs->Value = 0;
  pVVar10 = p->vCis;
  if (0 < pVVar10->nSize) {
    lVar17 = 0;
    do {
      iVar1 = pVVar10->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0070a677;
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      pGVar11 = Gia_ManAppendObj(p_00);
      uVar13 = *(ulong *)pGVar11;
      *(ulong *)pGVar11 = uVar13 | 0x9fffffff;
      *(ulong *)pGVar11 =
           uVar13 & 0xe0000000ffffffff | 0x9fffffff |
           (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_0070a658;
      Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
      pGVar4 = p_00->pObjs;
      if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_0070a658;
      pGVar3[iVar1].Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
      lVar17 = lVar17 + 1;
      pVVar10 = p->vCis;
    } while (lVar17 < pVVar10->nSize);
  }
  p_01 = Bal_ManAlloc(p,p_00,nLutSize,nCutNum,fVerbose);
  Gia_ManHashStart(p_00);
  pVVar10 = p->vCos;
  uVar13 = (ulong)(uint)pVVar10->nSize;
  if (0 < pVVar10->nSize) {
    lVar17 = 0;
    do {
      iVar6 = (int)uVar13;
      iVar1 = pVVar10->pArray[lVar17];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0070a677;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      pGVar3 = p->pObjs + iVar1;
      Gia_ManBalance_rec(p_00,p,pGVar3 + -(ulong)((uint)*(undefined8 *)pGVar3 & 0x1fffffff));
      lVar17 = lVar17 + 1;
      pVVar10 = p->vCos;
      iVar6 = pVVar10->nSize;
      uVar13 = (ulong)iVar6;
    } while (lVar17 < (long)uVar13);
    if (0 < iVar6) {
      lVar17 = 0;
      do {
        iVar1 = pVVar10->pArray[lVar17];
        if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_0070a677;
        if (p->pObjs == (Gia_Obj_t *)0x0) break;
        pGVar3 = p->pObjs + iVar1;
        uVar5 = *(undefined8 *)pGVar3;
        uVar18 = pGVar3[-(ulong)((uint)uVar5 & 0x1fffffff)].Value;
        if ((int)uVar18 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                        ,0x132,"int Abc_LitNotCond(int, int)");
        }
        uVar16 = uVar18 >> 1;
        if (p_00->nObjs <= (int)uVar16) {
          __assert_fail("iLit0 >= 0 && Abc_Lit2Var(iLit0) < Gia_ManObjNum(p)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x314,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        if ((~*(uint *)(p_00->pObjs + uVar16) & 0x1fffffff) != 0 &&
            (int)*(uint *)(p_00->pObjs + uVar16) < 0) {
          __assert_fail("!Gia_ObjIsCo(Gia_ManObj(p, Abc_Lit2Var(iLit0)))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x315,"int Gia_ManAppendCo(Gia_Man_t *, int)");
        }
        pGVar11 = Gia_ManAppendObj(p_00);
        uVar13 = *(ulong *)pGVar11;
        *(ulong *)pGVar11 = uVar13 | 0x80000000;
        pGVar4 = p_00->pObjs;
        if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) {
LAB_0070a658:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        uVar14 = (ulong)(((uint)((int)pGVar11 - (int)pGVar4) >> 2) * -0x55555555 - uVar16 &
                        0x1fffffff);
        uVar19 = (ulong)((uVar18 << 0x1d ^ (uint)uVar5) & 0x20000000);
        *(ulong *)pGVar11 = uVar19 | uVar13 & 0xffffffffc0000000 | 0x80000000 | uVar14;
        *(ulong *)pGVar11 =
             uVar19 | uVar13 & 0xe0000000c0000000 | 0x80000000 | uVar14 |
             (ulong)(p_00->vCos->nSize & 0x1fffffff) << 0x20;
        pGVar4 = p_00->pObjs;
        if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_0070a658;
        Vec_IntPush(p_00->vCos,(int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * -0x55555555);
        if (p_00->pFanData != (int *)0x0) {
          Gia_ObjAddFanout(p_00,pGVar11 + -(ulong)((uint)*(undefined8 *)pGVar11 & 0x1fffffff),
                           pGVar11);
        }
        pGVar4 = p_00->pObjs;
        if ((pGVar11 < pGVar4) || (pGVar4 + p_00->nObjs <= pGVar11)) goto LAB_0070a658;
        pGVar3->Value = (int)((ulong)((long)pGVar11 - (long)pGVar4) >> 2) * 0x55555556;
        lVar17 = lVar17 + 1;
        pVVar10 = p->vCos;
      } while (lVar17 < pVVar10->nSize);
    }
  }
  lVar17 = (long)p_00->vCos->nSize;
  if (lVar17 < 1) {
    uVar13 = 0;
  }
  else {
    lVar15 = 0;
    uVar13 = 0;
    do {
      iVar1 = p_00->vCos->pArray[lVar15];
      if (((long)iVar1 < 0) || (p_00->nObjs <= iVar1)) {
LAB_0070a677:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if (p_00->pObjs == (Gia_Obj_t *)0x0) break;
      uVar18 = iVar1 - (*(uint *)(p_00->pObjs + iVar1) & 0x1fffffff);
      if (((int)uVar18 < 0) || (p_01->vCosts->nSize <= (int)uVar18)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar18 = p_01->vCosts->pArray[uVar18] >> 4;
      if ((int)uVar13 <= (int)uVar18) {
        uVar13 = (ulong)uVar18;
      }
      lVar15 = lVar15 + 1;
    } while (lVar17 != lVar15);
  }
  printf("Best delay = %d\n",uVar13);
  Gia_ManHashStop(p_00);
  Gia_ManSetRegNum(p_00,p->nRegs);
  Bal_ManFree(p_01);
  pGVar12 = Gia_ManCleanup(p_00);
  Gia_ManStop(p_00);
  return pGVar12;
}

Assistant:

static inline Gia_Man_t * Gia_ManBalanceInt( Gia_Man_t * p, int nLutSize, int nCutNum, int fVerbose )
{
    Bal_Man_t * pMan;
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( 3*Gia_ManObjNum(p)/2 );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    pNew->vLevels = Vec_IntStart( pNew->nObjsAlloc );
    // create constant and inputs
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCi( p, pObj, i )
        pObj->Value = Gia_ManAppendCi( pNew );
    // create balancing manager
    pMan = Bal_ManAlloc( p, pNew, nLutSize, nCutNum, fVerbose );
    // create internal nodes
    Gia_ManHashStart( pNew );
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManBalance_rec( pNew, p, Gia_ObjFanin0(pObj) );
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
//    if ( fVerbose )
    {
        int nLevelMax = 0;
        Gia_ManForEachCo( pNew, pObj, i )
        {
            nLevelMax = Abc_MaxInt( nLevelMax, Bal_ObjDelay(pMan, Gia_ObjFaninId0p(pNew, pObj)) );
//            printf( "%d=%d ", i, Bal_ObjDelay(pMan, Gia_ObjFaninId0p(pNew, pObj)) );
        }
        printf( "Best delay = %d\n", nLevelMax );
    }

//    assert( Gia_ManObjNum(pNew) <= Gia_ManObjNum(p) );
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // delete manager
    Bal_ManFree( pMan );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}